

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O1

wchar_t ismode(char *start,char *end,wchar_t *permset)

{
  uint uVar1;
  ulong uVar2;
  
  if (end <= start) {
    return L'\0';
  }
  *permset = L'\0';
  do {
    uVar1 = (byte)*start - 0x52;
    uVar2 = (ulong)uVar1;
    if (uVar1 < 0x27) {
      if ((0x100000001U >> (uVar2 & 0x3f) & 1) == 0) {
        if ((0x2000000020U >> (uVar2 & 0x3f) & 1) == 0) {
          if ((0x4000000040U >> (uVar2 & 0x3f) & 1) == 0) goto LAB_00156cd3;
          uVar1 = 1;
        }
        else {
          uVar1 = 2;
        }
      }
      else {
        uVar1 = 4;
      }
      *permset = *permset | uVar1;
    }
    else {
LAB_00156cd3:
      if (*start != 0x2d) {
        return L'\0';
      }
    }
    start = (char *)((byte *)start + 1);
    if (start == end) {
      return L'\x01';
    }
  } while( true );
}

Assistant:

static int
ismode(const char *start, const char *end, int *permset)
{
	const char *p;

	if (start >= end)
		return (0);
	p = start;
	*permset = 0;
	while (p < end) {
		switch (*p++) {
		case 'r': case 'R':
			*permset |= ARCHIVE_ENTRY_ACL_READ;
			break;
		case 'w': case 'W':
			*permset |= ARCHIVE_ENTRY_ACL_WRITE;
			break;
		case 'x': case 'X':
			*permset |= ARCHIVE_ENTRY_ACL_EXECUTE;
			break;
		case '-':
			break;
		default:
			return (0);
		}
	}
	return (1);
}